

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeLangevin.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeLangevin::initialize(FluctuatingChargeLangevin *this)

{
  bool bVar1;
  long in_RDI;
  RealType RVar2;
  RealType stdDev;
  FluctuatingChargePropagator *in_stack_00000140;
  result_type_conflict1 in_stack_ffffffffffffffd0;
  result_type_conflict1 in_stack_ffffffffffffffd8;
  normal_distribution<double> *in_stack_ffffffffffffffe0;
  undefined1 local_18;
  
  FluctuatingChargePropagator::initialize(in_stack_00000140);
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x18));
    bVar1 = Globals::haveDt((Globals *)0x30723a);
    if (bVar1) {
      SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x18));
      RVar2 = Globals::getDt((Globals *)0x307255);
      *(RealType *)(in_RDI + 0x50) = RVar2;
      *(double *)(in_RDI + 0x48) = *(double *)(in_RDI + 0x50) * 0.5;
    }
    else {
      snprintf(painCave.errMsg,2000,"FluctuatingChargeLangevin Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }
    bVar1 = FluctuatingChargeParameters::haveTargetTemp((FluctuatingChargeParameters *)0x3072af);
    if (bVar1) {
      RVar2 = FluctuatingChargeParameters::getTargetTemp((FluctuatingChargeParameters *)0x307303);
      *(RealType *)(in_RDI + 0x38) = RVar2;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "You can\'t use the FluctuatingChargeLangevin propagator without a flucQ.targetTemp!\n"
              );
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    bVar1 = FluctuatingChargeParameters::haveDragCoefficient
                      ((FluctuatingChargeParameters *)0x307319);
    if (bVar1) {
      RVar2 = FluctuatingChargeParameters::getDragCoefficient
                        ((FluctuatingChargeParameters *)0x30736d);
      *(RealType *)(in_RDI + 0x40) = RVar2;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "If you use the FluctuatingChargeLangevin\n\tpropagator, you must set flucQ.dragCoefficient .\n"
              );
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
  }
  sqrt((*(double *)(in_RDI + 0x38) * 0.0039744312 * *(double *)(in_RDI + 0x40)) /
       *(double *)(in_RDI + 0x50));
  std::normal_distribution<double>::normal_distribution
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *(result_type_conflict1 *)(in_RDI + 0x70) = in_stack_ffffffffffffffd0;
  *(result_type_conflict1 *)(in_RDI + 0x78) = in_stack_ffffffffffffffd8;
  *(normal_distribution<double> **)(in_RDI + 0x80) = in_stack_ffffffffffffffe0;
  *(undefined1 *)(in_RDI + 0x88) = local_18;
  return;
}

Assistant:

void FluctuatingChargeLangevin::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeLangevin Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!fqParams_->haveTargetTemp()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "You can't use the FluctuatingChargeLangevin "
                 "propagator without a flucQ.targetTemp!\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      } else {
        targetTemp_ = fqParams_->getTargetTemp();
      }

      // We must set tauThermostat.

      if (!fqParams_->haveDragCoefficient()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "If you use the FluctuatingChargeLangevin\n"
                 "\tpropagator, you must set flucQ.dragCoefficient .\n");

        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      } else {
        drag_ = fqParams_->getDragCoefficient();
      }
    }

    RealType stdDev =
        std::sqrt(2.0 * Constants::kb * targetTemp_ * drag_ / dt_);

    forceDistribution_ = std::normal_distribution<RealType>(0.0, stdDev);
  }